

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O1

void Am_Delete_Char_After_Cursor(Am_Object *text)

{
  bool bVar1;
  int from;
  int iVar2;
  Am_Code_Flag AVar3;
  Am_Value *pAVar4;
  char *pcVar5;
  Am_String old_str;
  Am_String local_40;
  Am_String local_38;
  Am_Object local_30;
  Am_Object local_28;
  
  pAVar4 = Am_Object::Get(text,0xe4,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
  if (bVar1) {
    Am_Object::Am_Object(&local_28,text);
    Am_Delete_Entire_String(&local_28);
    Am_Object::~Am_Object(&local_28);
    return;
  }
  pAVar4 = Am_Object::Get(text,0xad,0);
  from = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(text,0xab,0);
  Am_String::Am_String(&local_38,pAVar4);
  pcVar5 = Am_String::operator_cast_to_char_(&local_38);
  iVar2 = ml_strlen(pcVar5);
  Am_Object::Am_Object(&local_30,text);
  AVar3 = ml_which_code(&local_30);
  Am_Object::~Am_Object(&local_30);
  if (AVar3 == Am_ONE_BYTE_CODE) {
    if (iVar2 <= from || from < 0) goto LAB_001dd41a;
    pcVar5 = Am_String::operator_cast_to_char_(&local_38);
    pcVar5 = Am_Delete_Substring(pcVar5,from,from + 1);
    Am_String::Am_String(&local_40,pcVar5,false);
    Am_Object::Set(text,0xab,&local_40,0);
  }
  else {
    if (iVar2 + -1 <= from || from < 0) goto LAB_001dd41a;
    pcVar5 = Am_String::operator_cast_to_char_(&local_38);
    pcVar5 = Am_Delete_Substring(pcVar5,from,from + 2);
    Am_String::Am_String(&local_40,pcVar5,false);
    Am_Object::Set(text,0xab,&local_40,0);
  }
  Am_String::~Am_String(&local_40);
LAB_001dd41a:
  Am_String::~Am_String(&local_38);
  return;
}

Assistant:

void
Am_Delete_Char_After_Cursor(Am_Object text)
{
  if ((bool)text.Get(Am_PENDING_DELETE)) //delete all text first
    Am_Delete_Entire_String(text);
  else {
    int cursor_index = text.Get(Am_CURSOR_INDEX);
    Am_String old_str = text.Get(Am_TEXT);
    int str_len = ml_strlen((const char *)old_str);
    char *new_str;

    switch (ml_which_code(text)) {
    case Am_ONE_BYTE_CODE:
      if (0 <= cursor_index && cursor_index < str_len) {
        new_str = Am_Delete_Substring(old_str, cursor_index, cursor_index + 1);
        text.Set(Am_TEXT, Am_String(new_str, false));
      }
      break;
    case Am_TWO_BYTE_CODE:
      if (0 <= cursor_index && cursor_index < str_len - 1) {
        new_str = Am_Delete_Substring(old_str, cursor_index, cursor_index + 2);
        text.Set(Am_TEXT, Am_String(new_str, false));
      }
      break;
    case Am_SHIFT_JIS_CODE:
      if (0 <= cursor_index && cursor_index < str_len - 1 &&
          ml_two_byte_SHIFT_JIS(&(((const char *)old_str)[cursor_index]),
                                (const char *)old_str)) {
        new_str = Am_Delete_Substring(old_str, cursor_index, cursor_index + 2);
        text.Set(Am_TEXT, Am_String(new_str, false));
      } else if (0 <= cursor_index && cursor_index < str_len) {
        new_str = Am_Delete_Substring(old_str, cursor_index, cursor_index + 1);
        text.Set(Am_TEXT, Am_String(new_str, false));
      }
      break;
    }
  }
}